

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecode.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_bytecodeInterpreter_interpretSend
          (sysbvm_context_t *context,sysbvm_tuple_t receiverType,sysbvm_tuple_t selector,
          size_t argumentCount,sysbvm_tuple_t *receiverAndArguments)

{
  sysbvm_tuple_t sVar1;
  sysbvm_tuple_t arguments;
  size_t sVar2;
  sysbvm_tuple_t local_b8;
  sysbvm_tuple_t local_b0;
  
  sVar1 = sysbvm_type_lookupSelector(context,receiverType,selector);
  if (sVar1 == 0) {
    if ((context->roots).doesNotUnderstandSelector == selector) {
      sVar1 = 0;
    }
    else {
      sVar1 = sysbvm_type_lookupSelector(context,receiverType,selector);
    }
    if (sVar1 == 0) {
      sysbvm_error("Message not understood");
    }
    arguments = sysbvm_array_create(context,argumentCount);
    if (argumentCount != 0) {
      sVar2 = 0;
      do {
        if ((arguments & 0xf) == 0 && arguments != 0) {
          *(sysbvm_tuple_t *)(arguments + 0x10 + sVar2 * 8) = receiverAndArguments[sVar2 + 1];
        }
        sVar2 = sVar2 + 1;
      } while (argumentCount != sVar2);
    }
    local_b0 = sysbvm_message_create(context,selector,arguments,receiverType,0);
    local_b8 = *receiverAndArguments;
    sVar1 = sysbvm_function_apply(context,sVar1,2,&local_b8,0);
  }
  else {
    memcpy(&local_b8,receiverAndArguments,argumentCount * 8 + 8);
    sVar1 = sysbvm_bytecodeInterpreter_functionApplyNoCopyArguments
                      (context,sVar1,argumentCount + 1,&local_b8,0);
  }
  return sVar1;
}

Assistant:

static sysbvm_tuple_t sysbvm_bytecodeInterpreter_interpretSend(sysbvm_context_t *context, sysbvm_tuple_t receiverType, sysbvm_tuple_t selector, size_t argumentCount, sysbvm_tuple_t *receiverAndArguments)
{
    sysbvm_tuple_t method = sysbvm_type_lookupSelector(context, receiverType, selector);
    if(method)
        return sysbvm_bytecodeInterpreter_functionApply(context, method, argumentCount + 1, receiverAndArguments, 0);

    // Attempt to send doesNotUnderstand:
    if(selector != context->roots.doesNotUnderstandSelector)
        method = sysbvm_type_lookupSelector(context, receiverType, selector);
    if(!method)
        sysbvm_error("Message not understood");

    // Make the message.
    sysbvm_tuple_t arguments = sysbvm_array_create(context, argumentCount);
    for(size_t i = 0; i < argumentCount; ++i)
        sysbvm_array_atPut(arguments, i, receiverAndArguments[1 + i]);

    sysbvm_tuple_t message = sysbvm_message_create(context, selector, arguments, receiverType, SYSBVM_NULL_TUPLE);
    return sysbvm_function_apply2(context, method, receiverAndArguments[0], message);
}